

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O1

bool myutils::parse_addr(char *addr,string *ip,int *port)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (*(short *)(addr + 4) != 0x2f2f || *(int *)addr != 0x3a706374) {
    return false;
  }
  pcVar2 = strrchr(addr + 6,0x3a);
  bVar3 = pcVar2 != (char *)0x0;
  if (bVar3) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,addr + 6,pcVar2);
    std::__cxx11::string::operator=((string *)ip,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    iVar1 = atoi(pcVar2 + 1);
    *port = iVar1;
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool parse_addr(const char* addr, string* ip, int* port)
    {
        if (memcmp(addr, "tcp://", 6) != 0) return false;
        const char* p = addr + 6;
        const char* p2 = strrchr(p, ':');
        if (p2) {
            *ip = string(p, p2 - p);
            *port = atoi(p2 + 1);
            return true;
        }
        else {
            return false;
        }
    }